

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmTargetTraceDependencies::QueueSource(cmTargetTraceDependencies *this,cmSourceFile *sf)

{
  iterator *piVar1;
  _Elt_pointer ppcVar2;
  string *__x;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar3;
  cmSourceFile *local_18;
  
  local_18 = sf;
  pVar3 = std::
          _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
          ::_M_insert_unique<cmSourceFile*const&>
                    ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                      *)&this->SourcesQueued,&local_18);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    ppcVar2 = (this->SourceQueue).c.
              super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppcVar2 ==
        (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<cmSourceFile*,std::allocator<cmSourceFile*>>::_M_push_back_aux<cmSourceFile*const&>
                ((deque<cmSourceFile*,std::allocator<cmSourceFile*>> *)&this->SourceQueue,&local_18)
      ;
    }
    else {
      *ppcVar2 = local_18;
      piVar1 = &(this->SourceQueue).c.
                super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    __x = cmSourceFile::GetFullPath(local_18,(string *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->NewSources,__x);
  }
  return;
}

Assistant:

void cmTargetTraceDependencies::QueueSource(cmSourceFile* sf)
{
  if(this->SourcesQueued.insert(sf).second)
    {
    this->SourceQueue.push(sf);

    // Make sure this file is in the target at the end.
    this->NewSources.push_back(sf->GetFullPath());
    }
}